

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_left_join.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownLeftJoin
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *left_bindings,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *right_bindings)

{
  __buckets_ptr pp_Var1;
  pointer pLVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  ClientContext *context;
  undefined8 uVar4;
  pointer puVar5;
  __node_base __it;
  JoinSide JVar6;
  bool bVar7;
  FilterResult FVar8;
  int iVar9;
  pointer pLVar10;
  pointer pLVar11;
  pointer pEVar12;
  reference pvVar13;
  pointer pFVar14;
  pointer pLVar15;
  type pLVar16;
  reference pvVar17;
  type expr;
  reference pvVar18;
  LogicalAnyJoin *pLVar19;
  reference __k;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *this_00;
  reference other;
  unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
  *left_filter;
  pointer this_01;
  __node_base *p_Var20;
  unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
  *__args;
  pointer __args_00;
  unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
  *puVar21;
  pointer *__ptr;
  ulong uVar22;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_R8;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *pvVar23;
  ulong __n;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var24;
  ulong uVar25;
  undefined1 local_4f8 [16];
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
  *local_4e8;
  FilterPushdown *local_4e0;
  undefined1 local_4d8 [8];
  _Head_base<0UL,_duckdb::LogicalFilter_*,_false> local_4d0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_4c8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_4c0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_4b8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_4b0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_4a8;
  undefined4 local_49c;
  pointer local_498;
  LogicalOperator *local_490;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_488;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_480;
  LogicalOperator *local_478;
  undefined1 local_470 [8];
  Value val;
  vector<duckdb::ColumnBinding,_true> column_bindings;
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
  remaining_filters;
  unordered_map<unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>_>
  projections_groups;
  LogicalType local_380;
  FilterCombiner filter_combiner;
  FilterPushdown right_pushdown;
  FilterPushdown left_pushdown;
  
  pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)left_bindings);
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)left_bindings);
  if (pLVar11->type == LOGICAL_DELIM_JOIN) {
    pp_Var1 = (left_bindings->_M_h)._M_buckets;
    (left_bindings->_M_h)._M_buckets = (__buckets_ptr)0x0;
    FinishPushdown(this,op);
    if (pp_Var1 == (__buckets_ptr)0x0) {
      return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              )this;
    }
    (*(code *)(*pp_Var1)[1]._M_nxt)();
    return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>)
           this;
  }
  local_4f8._8_8_ = left_bindings;
  FilterPushdown(&left_pushdown,
                 (Optimizer *)
                 (op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 *(bool *)&op[0x20].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  FilterPushdown(&right_pushdown,
                 (Optimizer *)
                 (op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 *(bool *)&op[0x20].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  local_4e0 = (FilterPushdown *)op;
  FilterCombiner::FilterCombiner
            (&filter_combiner,
             (Optimizer *)
             (op->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_4f8._8_8_);
  if ((pLVar11->type == LOGICAL_COMPARISON_JOIN) ||
     (pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_4f8._8_8_), pLVar11->type == LOGICAL_ASOF_JOIN)) {
    pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_4f8._8_8_);
    pLVar2 = (pointer)pLVar11[1].estimated_cardinality;
    for (this_01 = pLVar11[1].types.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage; this_01 != pLVar2;
        this_01 = this_01 + 1) {
      pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)this_01);
      (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&projections_groups,pEVar12);
      pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&this_01->type_info_);
      (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&column_bindings,pEVar12);
      make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((duckdb *)&val,
                 (ExpressionType *)
                 &(this_01->type_info_).internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &projections_groups,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &column_bindings);
      local_4a8._M_head_impl = (Expression *)val.type_._0_8_;
      val.type_.id_ = INVALID;
      val.type_.physical_type_ = ~INVALID;
      val.type_._2_6_ = 0;
      FVar8 = FilterCombiner::AddFilter
                        (&filter_combiner,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_4a8);
      if (local_4a8._M_head_impl != (Expression *)0x0) {
        FVar8 = (*((local_4a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      pLVar11 = (pointer)(ulong)FVar8;
      local_4a8._M_head_impl = (Expression *)0x0;
      if (val.type_._0_8_ != 0) {
        pLVar11 = (pointer)(**(code **)(*(long *)val.type_._0_8_ + 8))();
      }
      val.type_.id_ = INVALID;
      val.type_.physical_type_ = ~INVALID;
      val.type_._2_6_ = 0;
      if (column_bindings.
          super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        pLVar11 = (pointer)(**(code **)((column_bindings.
                                         super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                         .
                                         super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->table_index + 8
                                       ))();
      }
      if (projections_groups._M_h._M_buckets != (__buckets_ptr)0x0) {
        pLVar11 = (pointer)(*(code *)(*projections_groups._M_h._M_buckets)[1]._M_nxt)();
      }
    }
    local_49c = (undefined4)CONCAT71((int7)((ulong)pLVar11 >> 8),1);
  }
  else {
    local_49c = 0;
  }
  remaining_filters.
  super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  remaining_filters.
  super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  remaining_filters.
  super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4e8 = (vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
               *)&local_4e0->filters;
  for (uVar25 = 0;
      uVar25 < (ulong)((long)(local_4e0->filters).
                             super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_4e0->filters).
                             super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar25 = uVar25 + 1) {
    pvVar13 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                           *)local_4e8,uVar25);
    pFVar14 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
              ::operator->(pvVar13);
    JVar6 = JoinSide::GetJoinSide(&pFVar14->bindings,right_bindings,in_R8);
    if (JVar6.value == LEFT) {
      if ((char)local_49c != '\0') {
        pvVar13 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                               *)local_4e8,uVar25);
        pFVar14 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                  ::operator->(pvVar13);
        pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(&pFVar14->filter);
        (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_4b0,pEVar12);
        FilterCombiner::AddFilter
                  (&filter_combiner,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_4b0);
        if (local_4b0._M_head_impl != (Expression *)0x0) {
          (*((local_4b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_4b0._M_head_impl = (Expression *)0x0;
      }
      pvVar13 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                             *)local_4e8,uVar25);
      ::std::
      vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
                ((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
                  *)&left_pushdown.filters,pvVar13);
      vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
      ::erase_at((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                  *)local_4e8,uVar25);
LAB_012380e6:
      uVar25 = uVar25 - 1;
    }
    else {
      pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_4f8._8_8_);
      if (pLVar11->type != LOGICAL_ASOF_JOIN) {
        _Var3._M_head_impl =
             (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *
               )&local_4e0->optimizer)->_M_t).
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        context = (ClientContext *)(_Var3._M_head_impl)->_vptr_LogicalOperator;
        pvVar13 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                               *)local_4e8,uVar25);
        pFVar14 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                  ::operator->(pvVar13);
        (**(code **)(*(long *)&((pFVar14->filter).
                                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                               super_BaseExpression + 0x88))(local_4f8);
        local_4d8 = (undefined1  [8])local_4f8._0_8_;
        local_4f8._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
        ReplaceColRefWithNull
                  ((duckdb *)&val,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_4d8,in_R8);
        uVar4 = local_4f8._0_8_;
        local_4f8[0] = val.type_.id_;
        local_4f8[1] = val.type_.physical_type_;
        local_4f8._2_6_ = val.type_._2_6_;
        if ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)uVar4 !=
            (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0) {
          (**(code **)(*(long *)uVar4 + 8))();
        }
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_4d8 != (Expression *)0x0) {
          (*(code *)(*(__node_base_ptr *)local_4d8)[1]._M_nxt)();
        }
        local_4d8 = (undefined1  [8])0x0;
        make_uniq<duckdb::LogicalFilter>();
        pLVar15 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                *)&local_4d0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&(pLVar15->super_LogicalOperator).expressions,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_4f8);
        pLVar16 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                  ::operator*((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                               *)&local_4d0);
        pvVar23 = &(_Var3._M_head_impl)->children;
        (**(code **)(*(long *)&pvVar23->
                               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                    + 0x10))(pvVar23,pLVar16);
        __n = 0;
        while( true ) {
          pLVar15 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                  *)&local_4d0);
          uVar22 = (long)(pLVar15->super_LogicalOperator).expressions.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pLVar15->super_LogicalOperator).expressions.
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          if (uVar22 <= __n) break;
          pLVar15 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                  *)&local_4d0);
          pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::get<true>(&(pLVar15->super_LogicalOperator).expressions,__n);
          pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(pvVar17);
          iVar9 = (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar12);
          if ((char)iVar9 == '\0') break;
          pLVar15 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                  *)&local_4d0);
          pvVar17 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::get<true>(&(pLVar15->super_LogicalOperator).expressions,__n);
          expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar17);
          ExpressionExecutor::EvaluateScalar((Value *)&projections_groups,context,expr,false);
          LogicalType::LogicalType((LogicalType *)&column_bindings,BOOLEAN);
          Value::DefaultCastAs
                    (&val,(Value *)&projections_groups,(LogicalType *)&column_bindings,false);
          LogicalType::~LogicalType((LogicalType *)&column_bindings);
          Value::~Value((Value *)&projections_groups);
          if ((val.is_null != false) || (bVar7 = BooleanValue::Get(&val), !bVar7)) {
            Value::~Value(&val);
            bVar7 = true;
            goto LAB_0123808a;
          }
          Value::~Value(&val);
          __n = __n + 1;
        }
        bVar7 = uVar22 <= __n;
LAB_0123808a:
        if (local_4d0._M_head_impl != (LogicalFilter *)0x0) {
          (**(code **)&(((((__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                            *)&((local_4d0._M_head_impl)->super_LogicalOperator).
                               _vptr_LogicalOperator)->
                         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                         )._M_t.
                         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                       super_BaseExpression).type)();
        }
        if ((Expression *)local_4f8._0_8_ != (Expression *)0x0) {
          (*(code *)(*(__node_base_ptr *)local_4f8._0_8_)[1]._M_nxt)();
        }
        if (!(bool)(bVar7 ^ 1U | uVar22 <= __n)) {
          pLVar10->field_0x61 = 3;
          for (__args_00 = left_pushdown.filters.
                           super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              puVar5 = remaining_filters.
                       super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
              puVar21 = remaining_filters.
                        super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              __args_00 !=
              left_pushdown.filters.
              super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; __args_00 = __args_00 + 1) {
            ::std::
            vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
                      (local_4e8,__args_00);
          }
          for (; puVar21 != puVar5; puVar21 = puVar21 + 1) {
            ::std::
            vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
                      (local_4e8,puVar21);
          }
          local_470 = (undefined1  [8])((_Hashtable *)local_4f8._8_8_)->_M_buckets;
          ((_Hashtable *)local_4f8._8_8_)->_M_buckets = (__buckets_ptr)0x0;
          PushdownInnerJoin(this,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                  *)local_4e0,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)local_470,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)local_4f8._8_8_);
          if (local_470 != (undefined1  [8])0x0) {
            (*(code *)(*(__node_base_ptr *)local_470)[1]._M_nxt)();
          }
          local_470 = (undefined1  [8])0x0;
          goto LAB_012386ae;
        }
        pvVar13 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                               *)local_4e8,uVar25);
        ::std::
        vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
                    *)&remaining_filters,pvVar13);
        vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
        ::erase_at((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
                    *)local_4e8,uVar25);
        goto LAB_012380e6;
      }
    }
  }
  val.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  val.is_null = false;
  val._25_7_ = 0;
  val.type_.id_ = INVALID;
  val.type_.physical_type_ = ~INVALID;
  val.type_._2_6_ = 0;
  val.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  val.type_._0_8_ = operator_new(0x18);
  *(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    **)val.type_._0_8_ = right_bindings;
  *(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    **)(val.type_._0_8_ + 8) = in_R8;
  *(FilterPushdown **)(val.type_._0_8_ + 0x10) = &right_pushdown;
  val._24_8_ = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_left_join.cpp:148:34)>
               ::_M_invoke;
  val.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ::std::
       _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/pushdown/pushdown_left_join.cpp:148:34)>
       ::_M_manager;
  FilterCombiner::GenerateFilters
            (&filter_combiner,
             (function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)>
              *)&val);
  ::std::_Function_base::~_Function_base((_Function_base *)&val);
  GenerateFilters(&right_pushdown);
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_4f8._8_8_);
  pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar11->children,0);
  local_478 = (pvVar18->
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar18->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  Rewrite((FilterPushdown *)&val,
          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *
          )&left_pushdown);
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_4f8._8_8_);
  pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar11->children,0);
  uVar4 = val.type_._0_8_;
  val.type_.id_ = INVALID;
  val.type_.physical_type_ = ~INVALID;
  val.type_._2_6_ = 0;
  _Var3._M_head_impl =
       (pvVar18->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar18->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)uVar4;
  if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  if (val.type_._0_8_ != 0) {
    (**(code **)(*(long *)val.type_._0_8_ + 8))();
  }
  val.type_.id_ = INVALID;
  val.type_.physical_type_ = ~INVALID;
  val.type_._2_6_ = 0;
  if (local_478 != (LogicalOperator *)0x0) {
    (*local_478->_vptr_LogicalOperator[1])();
  }
  local_478 = (LogicalOperator *)0x0;
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_4f8._8_8_);
  if (pLVar11->type == LOGICAL_ANY_JOIN) {
    pLVar19 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>(pLVar10);
    pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&pLVar19->condition);
    (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_4b8,pEVar12);
    FVar8 = AddFilter(local_4e0,
                      (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&local_4b8);
    if (local_4b8._M_head_impl != (Expression *)0x0) {
      (*((local_4b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_4b8._M_head_impl = (Expression *)0x0;
    if ((FVar8 == UNSATISFIABLE) &&
       ((pLVar19->super_LogicalJoin).super_LogicalOperator.field_0x61 == '\x01')) {
      projections_groups._M_h._M_buckets = &projections_groups._M_h._M_single_bucket;
      projections_groups._M_h._M_bucket_count = 1;
      projections_groups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      projections_groups._M_h._M_element_count = 0;
      projections_groups._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      projections_groups._M_h._M_rehash_policy._M_next_resize = 0;
      projections_groups._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_4f8._8_8_);
      pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar10->children,1);
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(pvVar18);
      (*pLVar10->_vptr_LogicalOperator[2])(&column_bindings,pLVar10);
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_4f8._8_8_);
      pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar10->children,1);
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(pvVar18);
      LogicalOperator::ResolveOperatorTypes(pLVar10);
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_4f8._8_8_);
      pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar10->children,1);
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(pvVar18);
      p_Var20 = &projections_groups._M_h._M_before_begin;
      for (uVar25 = 0; __it._M_nxt = projections_groups._M_h._M_before_begin._M_nxt,
          uVar25 < (ulong)((long)column_bindings.
                                 super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 .
                                 super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)column_bindings.
                                 super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 .
                                 super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar25 = uVar25 + 1) {
        __k = vector<duckdb::ColumnBinding,_true>::get<true>(&column_bindings,uVar25);
        this_00 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                   *)::std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&projections_groups,&__k->table_index);
        other = vector<duckdb::LogicalType,_true>::get<true>(&pLVar10->types,uVar25);
        LogicalType::LogicalType(&local_380,other);
        Value::Value(&val,&local_380);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)local_4f8,&val);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                  (this_00,(unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                            *)local_4f8);
        if ((Expression *)local_4f8._0_8_ != (Expression *)0x0) {
          (*(code *)((__node_base_ptr)((BaseExpression *)local_4f8._0_8_)->_vptr_BaseExpression)[1].
                    _M_nxt)();
        }
        local_4f8._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
        Value::~Value(&val);
        LogicalType::~LogicalType(&local_380);
      }
      val.type_._0_8_ = local_4e0;
      val.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&projections_groups;
      PushdownLeftJoin::anon_class_16_2_9e7a6fea::operator()
                ((anon_class_16_2_9e7a6fea *)local_4f8,(idx_t)&val);
      _Var24._M_head_impl = (Expression *)local_4f8._0_8_;
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&projections_groups._M_h,(const_iterator)__it._M_nxt);
      while (p_Var20 = p_Var20->_M_nxt, p_Var20 != (__node_base *)0x0) {
        PushdownLeftJoin::anon_class_16_2_9e7a6fea::operator()
                  ((anon_class_16_2_9e7a6fea *)local_4f8,(idx_t)&val);
        local_4c8._M_head_impl = (LogicalOperator *)local_4f8._0_8_;
        local_4f8._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
        local_4c0._M_head_impl = (LogicalOperator *)_Var24._M_head_impl;
        LogicalCrossProduct::Create
                  ((LogicalCrossProduct *)local_4d8,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_4c0,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_4c8);
        if (local_4c8._M_head_impl != (LogicalOperator *)0x0) {
          (*(code *)((__node_base_ptr)
                    ((BaseExpression *)&(local_4c8._M_head_impl)->_vptr_LogicalOperator)->
                    _vptr_BaseExpression)[1]._M_nxt)();
        }
        local_4c8._M_head_impl = (LogicalOperator *)0x0;
        if (local_4c0._M_head_impl != (LogicalOperator *)0x0) {
          (*(code *)((__node_base_ptr)
                    ((BaseExpression *)&(local_4c0._M_head_impl)->_vptr_LogicalOperator)->
                    _vptr_BaseExpression)[1]._M_nxt)();
        }
        _Var24._M_head_impl = (Expression *)local_4d8;
        local_4c0._M_head_impl = (LogicalOperator *)0x0;
        if ((Expression *)local_4f8._0_8_ != (Expression *)0x0) {
          (*(code *)(*(__node_base_ptr *)local_4f8._0_8_)[1]._M_nxt)();
        }
      }
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_4f8._8_8_);
      pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar10->children,0);
      local_480._M_head_impl =
           (pvVar18->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar18->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      local_488._M_head_impl = (LogicalOperator *)_Var24._M_head_impl;
      LogicalCrossProduct::Create
                ((LogicalCrossProduct *)local_4f8,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_480,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_488);
      uVar4 = local_4f8._0_8_;
      local_4f8._0_8_ = (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
      pp_Var1 = ((_Hashtable *)local_4f8._8_8_)->_M_buckets;
      ((_Hashtable *)local_4f8._8_8_)->_M_buckets = (__buckets_ptr)uVar4;
      if ((pp_Var1 != (__buckets_ptr)0x0) &&
         ((*(code *)(*pp_Var1)[1]._M_nxt)(),
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_4f8._0_8_ != (Expression *)0x0)) {
        (**(code **)(*(long *)local_4f8._0_8_ + 8))();
      }
      local_4f8._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      if (local_488._M_head_impl != (LogicalOperator *)0x0) {
        (*(code *)((__node_base_ptr)
                  ((BaseExpression *)&(local_488._M_head_impl)->_vptr_LogicalOperator)->
                  _vptr_BaseExpression)[1]._M_nxt)();
      }
      local_488._M_head_impl = (LogicalOperator *)0x0;
      if (local_480._M_head_impl != (LogicalOperator *)0x0) {
        (*(local_480._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      local_480._M_head_impl = (LogicalOperator *)0x0;
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                    &column_bindings);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&projections_groups._M_h);
      __args = remaining_filters.
               super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar21 = remaining_filters.
                super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0123865a;
    }
  }
  pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_4f8._8_8_);
  pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar10->children,1);
  local_490 = (pvVar18->
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar18->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  Rewrite((FilterPushdown *)&val,
          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *
          )&right_pushdown);
  pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_4f8._8_8_);
  pvVar18 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar10->children,1);
  uVar4 = val.type_._0_8_;
  val.type_.id_ = INVALID;
  val.type_.physical_type_ = ~INVALID;
  val.type_._2_6_ = 0;
  _Var3._M_head_impl =
       (pvVar18->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar18->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)uVar4;
  if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  if (val.type_._0_8_ != 0) {
    (**(code **)(*(long *)val.type_._0_8_ + 8))();
  }
  val.type_.id_ = INVALID;
  val.type_.physical_type_ = ~INVALID;
  val.type_._2_6_ = 0;
  if (local_490 != (LogicalOperator *)0x0) {
    (*local_490->_vptr_LogicalOperator[1])();
  }
  local_490 = (LogicalOperator *)0x0;
  __args = remaining_filters.
           super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar21 = remaining_filters.
            super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
LAB_0123865a:
  for (; __args != puVar21; __args = __args + 1) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
              (local_4e8,__args);
  }
  local_498 = (pointer)((_Hashtable *)local_4f8._8_8_)->_M_buckets;
  ((_Hashtable *)local_4f8._8_8_)->_M_buckets = (__buckets_ptr)0x0;
  PushFinalFilters(this,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                         *)local_4e0);
  if (local_498 != (pointer)0x0) {
    (*(code *)(*(__node_base_ptr *)local_498)[1]._M_nxt)();
  }
  local_498 = (pointer)0x0;
LAB_012386ae:
  ::std::
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  ::~vector(&remaining_filters.
             super_vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
           );
  FilterCombiner::~FilterCombiner(&filter_combiner);
  ~FilterPushdown(&right_pushdown);
  ~FilterPushdown(&left_pushdown);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownLeftJoin(unique_ptr<LogicalOperator> op,
                                                             unordered_set<idx_t> &left_bindings,
                                                             unordered_set<idx_t> &right_bindings) {
	auto &join = op->Cast<LogicalJoin>();
	if (op->type == LogicalOperatorType::LOGICAL_DELIM_JOIN) {
		return FinishPushdown(std::move(op));
	}
	FilterPushdown left_pushdown(optimizer, convert_mark_joins), right_pushdown(optimizer, convert_mark_joins);
	// for a comparison join we create a FilterCombiner that checks if we can push conditions on LHS join conditions
	// into the RHS of the join
	FilterCombiner filter_combiner(optimizer);
	const auto isComparison = (op->type == LogicalOperatorType::LOGICAL_COMPARISON_JOIN ||
	                           op->type == LogicalOperatorType::LOGICAL_ASOF_JOIN);
	if (isComparison) {
		// add all comparison conditions
		auto &comparison_join = op->Cast<LogicalComparisonJoin>();
		for (auto &cond : comparison_join.conditions) {
			filter_combiner.AddFilter(
			    make_uniq<BoundComparisonExpression>(cond.comparison, cond.left->Copy(), cond.right->Copy()));
		}
	}
	// now check the set of filters
	vector<unique_ptr<Filter>> remaining_filters;
	for (idx_t i = 0; i < filters.size(); i++) {
		auto side = JoinSide::GetJoinSide(filters[i]->bindings, left_bindings, right_bindings);
		if (side == JoinSide::LEFT) {
			// bindings match left side
			// we can push the filter into the left side
			if (isComparison) {
				// we MIGHT be able to push it down the RHS as well, but only if it is a comparison that matches the
				// join predicates we use the FilterCombiner to figure this out add the expression to the FilterCombiner
				filter_combiner.AddFilter(filters[i]->filter->Copy());
			}
			left_pushdown.filters.push_back(std::move(filters[i]));
			// erase the filter from the list of filters
			filters.erase_at(i);
			i--;
		} else if (op->type != LogicalOperatorType::LOGICAL_ASOF_JOIN) {
			// bindings match right side or both sides: we cannot directly push it into the right
			// however, if the filter removes rows with null values from the RHS we can turn the left outer join
			// in an inner join, and then push down as we would push down an inner join
			// Edit: This is only possible if the bindings match BOTH sides, so the filter can be pushed down to both
			// children. If the filter can only be applied to the right side, and the filter filters
			// all tuples, then the inner join cannot be converted.
			if (FilterRemovesNull(optimizer.context, optimizer.rewriter, filters[i]->filter.get(), right_bindings)) {
				// the filter removes NULL values, turn it into an inner join
				join.join_type = JoinType::INNER;
				// now we can do more pushdown
				// move all filters we added to the left_pushdown back into the filter list
				for (auto &left_filter : left_pushdown.filters) {
					filters.push_back(std::move(left_filter));
				}
				for (auto &filter : remaining_filters) {
					filters.push_back(std::move(filter));
				}
				// now push down the inner join
				return PushdownInnerJoin(std::move(op), left_bindings, right_bindings);
			}
			// we should keep the filters which do not remove NULL values
			remaining_filters.push_back(std::move(filters[i]));
			filters.erase_at(i);
			i--;
		}
	}
	// finally we check the FilterCombiner to see if there are any predicates we can push into the RHS
	// we only added (1) predicates that have JoinSide::BOTH from the conditions, and
	// (2) predicates that have JoinSide::LEFT from the filters
	// we check now if this combination generated any new filters that are only on JoinSide::RIGHT
	// this happens if, e.g. a join condition is (i=a) and there is a filter (i=500), we can then push the filter
	// (a=500) into the RHS
	filter_combiner.GenerateFilters([&](unique_ptr<Expression> filter) {
		if (JoinSide::GetJoinSide(*filter, left_bindings, right_bindings) == JoinSide::RIGHT) {
			right_pushdown.AddFilter(std::move(filter));
		}
	});
	right_pushdown.GenerateFilters();
	op->children[0] = left_pushdown.Rewrite(std::move(op->children[0]));

	bool rewrite_right = true;
	if (op->type == LogicalOperatorType::LOGICAL_ANY_JOIN) {
		auto &any_join = join.Cast<LogicalAnyJoin>();
		if (AddFilter(any_join.condition->Copy()) == FilterResult::UNSATISFIABLE) {
			// filter statically evaluates to false, turns it to the cross product join with 1 row NULLs
			if (any_join.join_type == JoinType::LEFT) {
				unordered_map<idx_t, vector<unique_ptr<Expression>>> projections_groups;
				auto column_bindings = op->children[1]->GetColumnBindings();
				op->children[1]->ResolveOperatorTypes();
				auto &types = op->children[1]->types;
				for (idx_t i = 0; i < column_bindings.size(); i++) {
					projections_groups[column_bindings[i].table_index].emplace_back(
					    make_uniq<BoundConstantExpression>(Value(types[i])));
				}

				auto create_proj_dummy_scan = [&](idx_t table_index) {
					auto dummy_scan = make_uniq<LogicalDummyScan>(optimizer.binder.GenerateTableIndex());
					auto proj = make_uniq<LogicalProjection>(table_index, std::move(projections_groups[table_index]));
					proj->AddChild(std::move(dummy_scan));
					return proj;
				};
				// make cross products on the RHS first
				auto begin = projections_groups.begin();
				D_ASSERT(begin != projections_groups.end());
				unique_ptr<LogicalOperator> left = create_proj_dummy_scan(begin->first);
				projections_groups.erase(begin);
				for (auto &group : projections_groups) {
					auto proj = create_proj_dummy_scan(group.first);
					auto op = LogicalCrossProduct::Create(std::move(left), std::move(proj));
					left = std::move(op);
				}
				// then make cross product with the LHS
				op = LogicalCrossProduct::Create(std::move(op->children[0]), std::move(left));
				rewrite_right = false;
			}
		}
	}

	if (rewrite_right) {
		op->children[1] = right_pushdown.Rewrite(std::move(op->children[1]));
	}

	for (auto &filter : remaining_filters) {
		filters.push_back(std::move(filter));
	}

	return PushFinalFilters(std::move(op));
}